

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseSimdConst
          (WastParser *this,Const *const_,Type in_type,int32_t nSimdConstBytes)

{
  Token *pTVar1;
  TokenType TVar2;
  Result RVar3;
  Enum EVar4;
  anon_union_16_5_a72a3a04_for_Const_2 *out;
  ulong uVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Location loc;
  Literal LStack_b0;
  long local_88;
  long local_80;
  undefined1 auStack_68 [8];
  Literal literal;
  allocator_type local_31;
  
  if (in_type == I32) {
    pTVar1 = (Token *)((long)&loc.field_1 + 8);
    GetToken(pTVar1,this);
    literal.text._M_dataplus._M_p = LStack_b0.text._M_dataplus._M_p;
    literal.text._M_string_length = LStack_b0.text._M_string_length;
    auStack_68 = (undefined1  [8])loc.field_1._8_8_;
    literal._0_8_ = LStack_b0._0_8_;
    Token::~Token(pTVar1);
    (const_->loc).field_1.field_1.offset = (size_t)literal.text._M_dataplus._M_p;
    *(size_type *)((long)&(const_->loc).field_1 + 8) = literal.text._M_string_length;
    (const_->loc).filename.data_ = (char *)auStack_68;
    (const_->loc).filename.size_ = literal._0_8_;
    if (0 < nSimdConstBytes >> 2) {
      out = &const_->field_2;
      uVar5 = (ulong)(uint)(nSimdConstBytes >> 2);
      pTVar1 = (Token *)(&loc.field_1.field_1 + 1);
      do {
        GetToken(pTVar1,this);
        loc.filename.size_ = (size_type)LStack_b0.text._M_dataplus._M_p;
        loc.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             LStack_b0.text._M_string_length;
        Token::~Token(pTVar1);
        TVar2 = Peek(this,0);
        if (TVar2 != Last_Literal) {
          loc.field_1._8_8_ = &LStack_b0.text;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)((long)&loc.field_1 + 8),"an Nat literal","");
          __l._M_len = 1;
          __l._M_array = (iterator)((long)&loc.field_1 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_68,__l,&local_31);
          RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)auStack_68,"123");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_68);
          if ((string *)loc.field_1._8_8_ == &LStack_b0.text) {
            return (Result)RVar3.enum_;
          }
          operator_delete((void *)loc.field_1._8_8_);
          return (Result)RVar3.enum_;
        }
        Consume(pTVar1,this);
        if (2 < LStack_b0.text.field_2._M_allocated_capacity._0_4_ - 0x26) {
          __assert_fail("HasLiteral()",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.h"
                        ,0x70,"const Literal &wabt::Token::literal() const");
        }
        auStack_68._0_4_ = LStack_b0.text.field_2._8_4_;
        literal._0_8_ = &literal.text._M_string_length;
        std::__cxx11::string::_M_construct<char*>((string *)&literal,local_88,local_80 + local_88);
        Token::~Token(pTVar1);
        RVar3 = ParseInt32((char *)literal._0_8_,literal.text._M_dataplus._M_p + literal._0_8_,
                           &out->u32,SignedAndUnsigned);
        if (RVar3.enum_ == Error) {
          Error(this,0x11d8d50,(char *)literal._0_8_);
        }
        if ((size_type *)literal._0_8_ != &literal.text._M_string_length) {
          operator_delete((void *)literal._0_8_);
        }
        if (RVar3.enum_ == Error) goto LAB_00f5f800;
        out = (anon_union_16_5_a72a3a04_for_Const_2 *)((long)out + 4);
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    EVar4 = Ok;
  }
  else {
    Error(this,0x11d8d65);
LAB_00f5f800:
    EVar4 = Error;
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseSimdConst(Const* const_,
                                  Type in_type,
                                  int32_t nSimdConstBytes) {
  WABT_TRACE(ParseSimdConst);

  // Parse the Simd Consts according to input data type.
  switch (in_type) {
    case Type::I32: {
      const_->loc = GetLocation();
      int Count = nSimdConstBytes / sizeof(uint32_t);
      // Meet expected "i32" token. start parse 4 i32 consts
      for (int i = 0; i < Count; i++) {
        Location loc = GetLocation();

        // Expected one 0xXXXXXXXX number
        if (!PeekMatch(TokenType::Nat))
          return ErrorExpected({"an Nat literal"}, "123");

        Literal literal = Consume().literal();

        string_view sv = literal.text;
        const char* s = sv.begin();
        const char* end = sv.end();
        Result result;

        result = ParseInt32(s, end, &(const_->v128_bits.v[i]),
                            ParseIntType::SignedAndUnsigned);

        if (Failed(result)) {
          Error(loc, "invalid literal \"%s\"", literal.text.c_str());
          return Result::Error;
        }
      }
      break;
    }

    default:
      Error(const_->loc, "Expected i32 at start of simd constant");
      return Result::Error;
  }

  return Result::Ok;
}